

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere)

{
  int iCur_00;
  sqlite3 *db_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Table *pTab_00;
  Trigger *pTrigger_00;
  Vdbe *v_00;
  WhereInfo *pWInfo_00;
  VTable *zP4;
  bool bVar4;
  int count;
  char *pVTab;
  int regRowid;
  int iRowid;
  int iRowSet;
  Trigger *pTrigger;
  int isView;
  int rcauth;
  int memCnt;
  int iDb;
  NameContext sNC;
  AuthContext sContext;
  sqlite3 *db;
  Index *pIStack_58;
  int iCur;
  Index *pIdx;
  WhereInfo *pWInfo;
  int i;
  int addr;
  int end;
  char *zDb;
  Table *pTab;
  Vdbe *v;
  Expr *pWhere_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  isView = -1;
  memset(&sNC.ncFlags,0,0x10);
  db_00 = pParse->db;
  if (((pParse->nErr == 0) && (db_00->mallocFailed == '\0')) &&
     (pTab_00 = sqlite3SrcListLookup(pParse,pTabList), pTab_00 != (Table *)0x0)) {
    pTrigger_00 = sqlite3TriggersExist(pParse,pTab_00,0x6a,(ExprList *)0x0,(int *)0x0);
    bVar4 = pTab_00->pSelect != (Select *)0x0;
    iVar1 = sqlite3ViewGetColumnNames(pParse,pTab_00);
    if ((iVar1 == 0) &&
       (iVar1 = sqlite3IsReadOnly(pParse,pTab_00,(uint)(pTrigger_00 != (Trigger *)0x0)), iVar1 == 0)
       ) {
      iVar1 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
      iVar2 = sqlite3AuthCheck(pParse,9,pTab_00->zName,(char *)0x0,db_00->aDb[iVar1].zName);
      if (iVar2 != 1) {
        iCur_00 = pParse->nTab;
        pParse->nTab = iCur_00 + 1;
        pTabList->a[0].iCursor = iCur_00;
        for (pIStack_58 = pTab_00->pIndex; pIStack_58 != (Index *)0x0;
            pIStack_58 = pIStack_58->pNext) {
          pParse->nTab = pParse->nTab + 1;
        }
        if (bVar4) {
          sqlite3AuthContextPush(pParse,(AuthContext *)&sNC.ncFlags,pTab_00->zName);
        }
        v_00 = sqlite3GetVdbe(pParse);
        if (v_00 != (Vdbe *)0x0) {
          if (pParse->nested == '\0') {
            sqlite3VdbeCountChanges(v_00);
          }
          sqlite3BeginWriteOperation(pParse,1,iVar1);
          if (bVar4) {
            sqlite3MaterializeView(pParse,pTab_00,pWhere,iCur_00);
          }
          memset(&memCnt,0,0x38);
          _memCnt = pParse;
          sNC.pParse = (Parse *)pTabList;
          iVar3 = sqlite3ResolveExprNames((NameContext *)&memCnt,pWhere);
          if (iVar3 == 0) {
            if ((db_00->flags & 0x10U) != 0) {
              isView = pParse->nMem + 1;
              pParse->nMem = isView;
              sqlite3VdbeAddOp2(v_00,7,0,isView);
            }
            if (((iVar2 == 0) && (pWhere == (Expr *)0x0)) &&
               ((pTrigger_00 == (Trigger *)0x0 &&
                (((pTab_00->tabFlags & 0x10) == 0 &&
                 (iVar2 = sqlite3FkRequired(pParse,pTab_00,(int *)0x0,0), iVar2 == 0)))))) {
              sqlite3VdbeAddOp4(v_00,0x67,pTab_00->tnum,iVar1,isView,pTab_00->zName,-2);
              for (pIStack_58 = pTab_00->pIndex; pIStack_58 != (Index *)0x0;
                  pIStack_58 = pIStack_58->pNext) {
                sqlite3VdbeAddOp2(v_00,0x67,pIStack_58->tnum,iVar1);
              }
            }
            else {
              iVar1 = pParse->nMem + 1;
              pParse->nMem = iVar1;
              iVar2 = pParse->nMem + 1;
              pParse->nMem = iVar2;
              sqlite3VdbeAddOp2(v_00,10,0,iVar1);
              pWInfo_00 = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,8
                                            ,0);
              if (pWInfo_00 == (WhereInfo *)0x0) goto LAB_001bacac;
              iVar3 = sqlite3ExprCodeGetColumn(pParse,pTab_00,-1,iCur_00,iVar2,'\0');
              sqlite3VdbeAddOp2(v_00,0x70,iVar1,iVar3);
              if ((db_00->flags & 0x10U) != 0) {
                sqlite3VdbeAddOp2(v_00,0x14,isView,1);
              }
              sqlite3WhereEnd(pWInfo_00);
              iVar3 = sqlite3VdbeMakeLabel(v_00);
              if (!bVar4) {
                sqlite3OpenTableAndIndices(pParse,pTab_00,iCur_00,0x28);
              }
              iVar1 = sqlite3VdbeAddOp3(v_00,0x71,iVar1,iVar3,iVar2);
              if ((pTab_00->tabFlags & 0x10) == 0) {
                sqlite3GenerateRowDelete
                          (pParse,pTab_00,iCur_00,iVar2,(uint)(pParse->nested == '\0'),pTrigger_00,
                           99);
              }
              else {
                zP4 = sqlite3GetVTable(db_00,pTab_00);
                sqlite3VtabMakeWritable(pParse,pTab_00);
                sqlite3VdbeAddOp4(v_00,0x8c,0,1,iVar2,(char *)zP4,-10);
                sqlite3VdbeChangeP5(v_00,'\x02');
                sqlite3MayAbort(pParse);
              }
              sqlite3VdbeAddOp2(v_00,1,0,iVar1);
              sqlite3VdbeResolveLabel(v_00,iVar3);
              if ((!bVar4) && ((pTab_00->tabFlags & 0x10) == 0)) {
                pWInfo._4_4_ = 1;
                for (pIStack_58 = pTab_00->pIndex; pIStack_58 != (Index *)0x0;
                    pIStack_58 = pIStack_58->pNext) {
                  sqlite3VdbeAddOp2(v_00,0x2d,iCur_00 + pWInfo._4_4_,pIStack_58->tnum);
                  pWInfo._4_4_ = pWInfo._4_4_ + 1;
                }
                sqlite3VdbeAddOp1(v_00,0x2d,iCur_00);
              }
            }
            if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3AutoincrementEnd(pParse);
            }
            if ((((db_00->flags & 0x10U) != 0) && (pParse->nested == '\0')) &&
               (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3VdbeAddOp2(v_00,0x10,isView,1);
              sqlite3VdbeSetNumCols(v_00,1);
              sqlite3VdbeSetColName(v_00,0,0,"rows deleted",(_func_void_void_ptr *)0x0);
            }
          }
        }
      }
    }
  }
LAB_001bacac:
  sqlite3AuthContextPop((AuthContext *)&sNC.ncFlags);
  sqlite3SrcListDelete(db_00,pTabList);
  sqlite3ExprDelete(db_00,pWhere);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere           /* The WHERE clause.  May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  const char *zDb;       /* Name of database holding pTab */
  int end, addr = 0;     /* A couple addresses of generated code */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iCur;              /* VDBE Cursor number for pTab */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = -1;       /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto delete_from_cleanup;
  }
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define isView 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, (pTrigger?1:0)) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  zDb = db->aDb[iDb].zName;
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign  cursor number to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, 1, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** a ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, pWhere, iCur);
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( db->flags & SQLITE_CountRows ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by 
  ** API function sqlite3_count_changes) to be set incorrectly.  */
  if( rcauth==SQLITE_OK && pWhere==0 && !pTrigger && !IsVirtual(pTab) 
   && 0==sqlite3FkRequired(pParse, pTab, 0, 0)
  ){
    assert( !isView );
    sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt,
                      pTab->zName, P4_STATIC);
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  /* The usual case: There is a WHERE clause so we have to scan through
  ** the table and pick which records to delete.
  */
  {
    int iRowSet = ++pParse->nMem;   /* Register for rowset of rows to delete */
    int iRowid = ++pParse->nMem;    /* Used for storing rowid values. */
    int regRowid;                   /* Actual register containing rowids */

    /* Collect rowids of every row to be deleted.
    */
    sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    pWInfo = sqlite3WhereBegin(
        pParse, pTabList, pWhere, 0, 0, WHERE_DUPLICATES_OK, 0
    );
    if( pWInfo==0 ) goto delete_from_cleanup;
    regRowid = sqlite3ExprCodeGetColumn(pParse, pTab, -1, iCur, iRowid, 0);
    sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, regRowid);
    if( db->flags & SQLITE_CountRows ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }
    sqlite3WhereEnd(pWInfo);

    /* Delete every item whose key was written to the list during the
    ** database scan.  We have to delete items after the scan is complete
    ** because deleting an item can change the scan order.  */
    end = sqlite3VdbeMakeLabel(v);

    /* Unless this is a view, open cursors for the table we are 
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF 
    ** triggers.  */
    if( !isView ){
      sqlite3OpenTableAndIndices(pParse, pTab, iCur, OP_OpenWrite);
    }

    addr = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, end, iRowid);

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iRowid, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
      sqlite3MayAbort(pParse);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, iCur, iRowid, count, pTrigger, OE_Default);
    }

    /* End of the delete loop */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
    sqlite3VdbeResolveLabel(v, end);

    /* Close the cursors open on the table and its indexes. */
    if( !isView && !IsVirtual(pTab) ){
      for(i=1, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
        sqlite3VdbeAddOp2(v, OP_Close, iCur + i, pIdx->tnum);
      }
      sqlite3VdbeAddOp1(v, OP_Close, iCur);
    }
  }

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( (db->flags&SQLITE_CountRows) && !pParse->nested && !pParse->pTriggerTab ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, memCnt, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows deleted", SQLITE_STATIC);
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
  return;
}